

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O1

mraa_result_t mraa_intel_edison_mmap_setup(mraa_gpio_context dev,mraa_boolean_t en)

{
  bool bVar1;
  mraa_result_t mVar2;
  int iVar3;
  uint8_t *puVar4;
  char *pcVar5;
  stat fd_stat;
  stat local_a0;
  
  if (dev == (mraa_gpio_context)0x0) {
    pcVar5 = "edison mmap: context not valid";
LAB_00118105:
    syslog(3,pcVar5);
    mVar2 = MRAA_ERROR_INVALID_HANDLE;
  }
  else {
    if (en == 0) {
      if ((dev->mmap_write != (_func_mraa_result_t_mraa_gpio_context_int *)0x0) ||
         (dev->mmap_read != (_func_int_mraa_gpio_context *)0x0)) {
        dev->mmap_write = (_func_mraa_result_t_mraa_gpio_context_int *)0x0;
        dev->mmap_read = (_func_int_mraa_gpio_context *)0x0;
        mmap_count = mmap_count - 1;
        if (mmap_count != 0) {
          return MRAA_SUCCESS;
        }
        if (mmap_reg != (uint8_t *)0x0) {
          munmap(mmap_reg,(long)mmap_size);
          mmap_reg = (uint8_t *)0x0;
          iVar3 = close(mmap_fd);
          if (iVar3 != 0) {
            return MRAA_ERROR_INVALID_RESOURCE;
          }
          return MRAA_SUCCESS;
        }
        syslog(3,"edison mmap: null register cant unsetup");
        return MRAA_ERROR_INVALID_RESOURCE;
      }
      pcVar5 = "edison mmap: can\'t disable disabled mmap gpio";
    }
    else {
      if ((dev->mmap_write == (_func_mraa_result_t_mraa_gpio_context_int *)0x0) ||
         (dev->mmap_read == (_func_int_mraa_gpio_context *)0x0)) {
        if (mmap_reg != (uint8_t *)0x0) {
LAB_00118129:
          dev->mmap_write = mraa_intel_edison_mmap_write;
          dev->mmap_read = mraa_intel_edison_mmap_read;
          mmap_count = mmap_count + 1;
          return MRAA_SUCCESS;
        }
        mmap_fd = open("/sys/devices/pci0000:00/0000:00:0c.0/resource0",2);
        if (-1 < mmap_fd) {
          iVar3 = fstat(mmap_fd,&local_a0);
          if (iVar3 == 0) {
            mmap_size = (int)local_a0.st_size;
            puVar4 = (uint8_t *)mmap((void *)0x0,local_a0.st_size,3,1,mmap_fd,0);
            mmap_reg = puVar4;
            if (puVar4 == (uint8_t *)0xffffffffffffffff) {
              bVar1 = false;
              syslog(3,"edison mmap: failed to mmap");
              mmap_reg = (uint8_t *)0x0;
              close(mmap_fd);
              puVar4 = (uint8_t *)0x6;
            }
            else {
              bVar1 = true;
            }
          }
          else {
            bVar1 = false;
            syslog(3,"edison map: unable to access resource0 file");
            puVar4 = (uint8_t *)0x5;
          }
          if (!bVar1) {
            return (mraa_result_t)puVar4;
          }
          goto LAB_00118129;
        }
        pcVar5 = "edison map: unable to open resource0 file";
        goto LAB_00118105;
      }
      pcVar5 = "edison mmap: can\'t enable enabled mmap gpio";
    }
    syslog(3,pcVar5);
    mVar2 = MRAA_ERROR_INVALID_PARAMETER;
  }
  return mVar2;
}

Assistant:

mraa_result_t
mraa_intel_edison_mmap_setup(mraa_gpio_context dev, mraa_boolean_t en)
{
    if (dev == NULL) {
        syslog(LOG_ERR, "edison mmap: context not valid");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (en == 0) {
        if (dev->mmap_write == NULL && dev->mmap_read == NULL) {
            syslog(LOG_ERR, "edison mmap: can't disable disabled mmap gpio");
            return MRAA_ERROR_INVALID_PARAMETER;
        }
        dev->mmap_write = NULL;
        dev->mmap_read = NULL;
        mmap_count--;
        if (mmap_count == 0) {
            return mraa_intel_edison_mmap_unsetup();
        }
        return MRAA_SUCCESS;
    }

    if (dev->mmap_write != NULL && dev->mmap_read != NULL) {
        syslog(LOG_ERR, "edison mmap: can't enable enabled mmap gpio");
        return MRAA_ERROR_INVALID_PARAMETER;
    }

    // Might need to make some elements of this thread safe.
    // For example only allow one thread to enter the following block
    // to prevent mmap'ing twice.
    if (mmap_reg == NULL) {
        if ((mmap_fd = open(MMAP_PATH, O_RDWR)) < 0) {
            syslog(LOG_ERR, "edison map: unable to open resource0 file");
            return MRAA_ERROR_INVALID_HANDLE;
        }

        struct stat fd_stat;
        if (fstat(mmap_fd, &fd_stat) != 0) {
            syslog(LOG_ERR, "edison map: unable to access resource0 file");
            return MRAA_ERROR_INVALID_HANDLE;
        }
        mmap_size = fd_stat.st_size;

        mmap_reg =
        (uint8_t*) mmap(NULL, fd_stat.st_size, PROT_READ | PROT_WRITE, MAP_FILE | MAP_SHARED, mmap_fd, 0);
        if (mmap_reg == MAP_FAILED) {
            syslog(LOG_ERR, "edison mmap: failed to mmap");
            mmap_reg = NULL;
            close(mmap_fd);
            return MRAA_ERROR_NO_RESOURCES;
        }
    }
    dev->mmap_write = &mraa_intel_edison_mmap_write;
    dev->mmap_read = &mraa_intel_edison_mmap_read;
    mmap_count++;

    return MRAA_SUCCESS;
}